

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<123UL> * __thiscall
mserialize::cx_strcat<41ul,41ul,41ul>
          (cx_string<123UL> *__return_storage_ptr__,mserialize *this,cx_string<41UL> *strings,
          cx_string<41UL> *strings_1,cx_string<41UL> *strings_2)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong auStack_c8 [5];
  mserialize *local_a0;
  cx_string<41UL> *local_98;
  cx_string<41UL> *local_90;
  char buffer [124];
  
  pcVar1 = buffer;
  buffer[0x70] = '\0';
  buffer[0x71] = '\0';
  buffer[0x72] = '\0';
  buffer[0x73] = '\0';
  buffer[0x74] = '\0';
  buffer[0x75] = '\0';
  buffer[0x76] = '\0';
  buffer[0x77] = '\0';
  buffer[0x78] = '\0';
  buffer[0x79] = '\0';
  buffer[0x7a] = '\0';
  buffer[0x7b] = '\0';
  buffer[0x60] = '\0';
  buffer[0x61] = '\0';
  buffer[0x62] = '\0';
  buffer[99] = '\0';
  buffer[100] = '\0';
  buffer[0x65] = '\0';
  buffer[0x66] = '\0';
  buffer[0x67] = '\0';
  buffer[0x68] = '\0';
  buffer[0x69] = '\0';
  buffer[0x6a] = '\0';
  buffer[0x6b] = '\0';
  buffer[0x6c] = '\0';
  buffer[0x6d] = '\0';
  buffer[0x6e] = '\0';
  buffer[0x6f] = '\0';
  buffer[0x50] = '\0';
  buffer[0x51] = '\0';
  buffer[0x52] = '\0';
  buffer[0x53] = '\0';
  buffer[0x54] = '\0';
  buffer[0x55] = '\0';
  buffer[0x56] = '\0';
  buffer[0x57] = '\0';
  buffer[0x58] = '\0';
  buffer[0x59] = '\0';
  buffer[0x5a] = '\0';
  buffer[0x5b] = '\0';
  buffer[0x5c] = '\0';
  buffer[0x5d] = '\0';
  buffer[0x5e] = '\0';
  buffer[0x5f] = '\0';
  buffer[0x40] = '\0';
  buffer[0x41] = '\0';
  buffer[0x42] = '\0';
  buffer[0x43] = '\0';
  buffer[0x44] = '\0';
  buffer[0x45] = '\0';
  buffer[0x46] = '\0';
  buffer[0x47] = '\0';
  buffer[0x48] = '\0';
  buffer[0x49] = '\0';
  buffer[0x4a] = '\0';
  buffer[0x4b] = '\0';
  buffer[0x4c] = '\0';
  buffer[0x4d] = '\0';
  buffer[0x4e] = '\0';
  buffer[0x4f] = '\0';
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  local_a0 = this;
  local_98 = strings;
  local_90 = strings_1;
  auStack_c8[1] = 0x29;
  auStack_c8[2] = 0x29;
  auStack_c8[3] = 0x29;
  for (lVar2 = 1; lVar2 != 4; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < auStack_c8[lVar2]; uVar3 = uVar3 + 1) {
      pcVar1[uVar3] = *(char *)(auStack_c8[lVar2 + 4] + uVar3);
    }
    pcVar1 = pcVar1 + uVar3;
  }
  cx_string<123UL>::cx_string(__return_storage_ptr__,buffer);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}